

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

void __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::link_node
          (KDTree<phosg::Vector2<long>,_long> *this,Node *new_node)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  Node *local_20;
  Node *n;
  Node *new_node_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  if (this->root == (Node *)0x0) {
    this->root = new_node;
    this->node_count = this->node_count + 1;
  }
  else {
    local_20 = this->root;
    while( true ) {
      while( true ) {
        lVar2 = Vector2<long>::at(&new_node->pt,local_20->dim);
        lVar3 = Vector2<long>::at(&local_20->pt,local_20->dim);
        if (lVar3 <= lVar2) break;
        if (local_20->before == (Node *)0x0) {
          sVar1 = local_20->dim;
          sVar4 = Vector2<long>::dimensions();
          new_node->dim = (sVar1 + 1) % sVar4;
          new_node->parent = local_20;
          local_20->before = new_node;
          this->node_count = this->node_count + 1;
          return;
        }
        local_20 = local_20->before;
      }
      if (local_20->after_or_equal == (Node *)0x0) break;
      local_20 = local_20->after_or_equal;
    }
    sVar1 = local_20->dim;
    sVar4 = Vector2<long>::dimensions();
    new_node->dim = (sVar1 + 1) % sVar4;
    new_node->parent = local_20;
    local_20->after_or_equal = new_node;
    this->node_count = this->node_count + 1;
  }
  return;
}

Assistant:

void KDTree<CoordType, ValueType>::link_node(Node* new_node) {
  if (this->root == nullptr) {
    this->root = new_node;
    this->node_count++;
    return;
  }

  Node* n = this->root;
  for (;;) {
    if (new_node->pt.at(n->dim) < n->pt.at(n->dim)) {
      if (n->before == nullptr) {
        new_node->dim = (n->dim + 1) % CoordType::dimensions();
        new_node->parent = n;
        n->before = new_node;
        this->node_count++;
        return;
      } else {
        n = n->before;
      }
    } else {
      if (n->after_or_equal == nullptr) {
        new_node->dim = (n->dim + 1) % CoordType::dimensions();
        new_node->parent = n;
        n->after_or_equal = new_node;
        this->node_count++;
        return;
      } else {
        n = n->after_or_equal;
      }
    }
  }
}